

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprImpliesExpr(Parse *pParse,Expr *pE1,Expr *pE2,int iTab)

{
  int iVar1;
  undefined4 in_ECX;
  Expr *in_RDX;
  Parse *in_RSI;
  Expr *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = sqlite3ExprCompare(in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0);
  if (iVar1 == 0) {
    return 1;
  }
  if ((in_RDX->op == '+') &&
     ((iVar1 = sqlite3ExprImpliesExpr
                         (in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0),
      iVar1 != 0 ||
      (iVar1 = sqlite3ExprImpliesExpr
                         (in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0),
      iVar1 != 0)))) {
    iVar1 = 1;
  }
  else {
    if ((in_RDX->op == '4') &&
       (iVar1 = exprImpliesNotNull((Parse *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),in_RDI,
                                   (Expr *)in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX),
       iVar1 != 0)) {
      return 1;
    }
    iVar1 = sqlite3ExprIsIIF((sqlite3 *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = sqlite3ExprImpliesExpr
                        (in_RSI,in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),0);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprImpliesExpr(
  const Parse *pParse,
  const Expr *pE1,
  const Expr *pE2,
  int iTab
){
  if( sqlite3ExprCompare(pParse, pE1, pE2, iTab)==0 ){
    return 1;
  }
  if( pE2->op==TK_OR
   && (sqlite3ExprImpliesExpr(pParse, pE1, pE2->pLeft, iTab)
             || sqlite3ExprImpliesExpr(pParse, pE1, pE2->pRight, iTab) )
  ){
    return 1;
  }
  if( pE2->op==TK_NOTNULL
   && exprImpliesNotNull(pParse, pE1, pE2->pLeft, iTab, 0)
  ){
    return 1;
  }
  if( sqlite3ExprIsIIF(pParse->db, pE1) ){
    return sqlite3ExprImpliesExpr(pParse,pE1->x.pList->a[0].pExpr,pE2,iTab);
  }
  return 0;
}